

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringCache.h
# Opt level: O0

JavascriptString * __thiscall
Js::StringCache::InitializeString<false,18ul>(StringCache *this,char16 (*value) [18])

{
  StaticType *type;
  StaticType **ppSVar1;
  ScriptContext *this_00;
  Recycler *recycler;
  JavascriptString *pJVar2;
  char16 (*value_local) [18];
  StringCache *this_local;
  
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_StaticType__
                      ((WriteBarrierPtr *)&this->stringTypeStatic);
  type = *ppSVar1;
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
  recycler = ScriptContext::GetRecycler(this_00);
  pJVar2 = &LiteralString::New(type,*value,0x11,recycler)->super_JavascriptString;
  return pJVar2;
}

Assistant:

JavascriptString* InitializeString(const char16(&value)[N]) const
    {
        if (withPropertyString)
        {
            const PropertyRecord* propertyRecord = nullptr;
            scriptContext->FindPropertyRecord(value, N - 1, &propertyRecord);
            AssertMsg(propertyRecord != nullptr, "Trying to create a propertystring for non property string?");
            Assert(IsBuiltInPropertyId(propertyRecord->GetPropertyId()));
            return scriptContext->GetPropertyString(propertyRecord->GetPropertyId());
        }
        else
        {
            return LiteralString::New(stringTypeStatic, value, N - 1 /*don't include terminating NUL*/, scriptContext->GetRecycler());
        }
    }